

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void write_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  byte bVar1;
  _Bool _Var2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  bs_write_ue(b,(uint)(sps_svc_ext->vui).vui_ext_num_entries_minus1);
  iVar4 = b->bits_left;
  uVar7 = 0;
  do {
    bVar1 = (sps_svc_ext->vui).vui_ext_dependency_id[uVar7];
    uVar5 = 2;
    do {
      iVar4 = iVar4 + -1;
      b->bits_left = iVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | ((bVar1 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar4 = b->bits_left;
      }
      if (iVar4 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar4 = 8;
      }
      bVar8 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar8);
    bVar1 = (sps_svc_ext->vui).vui_ext_quality_id[uVar7];
    uVar5 = 3;
    do {
      iVar4 = iVar4 + -1;
      b->bits_left = iVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | ((bVar1 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar4 = b->bits_left;
      }
      if (iVar4 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar4 = 8;
      }
      bVar8 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar8);
    bVar1 = (sps_svc_ext->vui).vui_ext_temporal_id[uVar7];
    uVar5 = 2;
    do {
      iVar4 = iVar4 + -1;
      b->bits_left = iVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | ((bVar1 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
        iVar4 = b->bits_left;
      }
      if (iVar4 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
        iVar4 = 8;
      }
      bVar8 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar8);
    bVar1 = (sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar7];
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | (byte)((bVar1 & 1) << ((byte)b->bits_left & 0x1f));
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar4 = 8;
    }
    if ((sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar7] == '\0') {
      pbVar3 = b->p;
    }
    else {
      uVar5 = (sps_svc_ext->vui).vui_ext_num_units_in_tick[uVar7];
      uVar6 = 0x1f;
      do {
        iVar4 = iVar4 + -1;
        b->bits_left = iVar4;
        pbVar3 = b->p;
        if (pbVar3 < b->end) {
          *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | ((uVar5 >> (uVar6 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          iVar4 = b->bits_left;
        }
        if (iVar4 == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
          iVar4 = 8;
        }
        bVar8 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar8);
      uVar5 = (sps_svc_ext->vui).vui_ext_time_scale[uVar7];
      uVar6 = 0x1f;
      do {
        iVar4 = iVar4 + -1;
        b->bits_left = iVar4;
        pbVar3 = b->p;
        if (pbVar3 < b->end) {
          *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | ((uVar5 >> (uVar6 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          iVar4 = b->bits_left;
        }
        if (iVar4 == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
          iVar4 = 8;
        }
        bVar8 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar8);
      _Var2 = (sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[uVar7];
      iVar4 = iVar4 + -1;
      b->bits_left = iVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | _Var2 << ((byte)b->bits_left & 0x1f);
        iVar4 = b->bits_left;
        pbVar3 = b->p;
      }
      if (iVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        iVar4 = 8;
      }
    }
    _Var2 = (sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar7];
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | _Var2 << ((byte)b->bits_left & 0x1f);
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar4 = 8;
    }
    if ((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar7] == true) {
      write_hrd_parameters(sps_svc_ext->hrd_vcl + uVar7,b);
      iVar4 = b->bits_left;
    }
    _Var2 = (sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar7];
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | _Var2 << ((byte)b->bits_left & 0x1f);
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar7] == true) {
      write_hrd_parameters(sps_svc_ext->hrd_nal + uVar7,b);
    }
    if ((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar7] == true) {
      iVar4 = b->bits_left;
      pbVar3 = b->p;
LAB_0012db33:
      _Var2 = (sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[uVar7];
      iVar4 = iVar4 + -1;
      b->bits_left = iVar4;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | _Var2 << ((byte)b->bits_left & 0x1f);
        iVar4 = b->bits_left;
        pbVar3 = b->p;
      }
      if (iVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        iVar4 = 8;
      }
    }
    else {
      iVar4 = b->bits_left;
      pbVar3 = b->p;
      if ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar7] == true)
      goto LAB_0012db33;
    }
    _Var2 = (sps_svc_ext->vui).vui_ext_pic_struct_present_flag[uVar7];
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | _Var2 << ((byte)b->bits_left & 0x1f);
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar4 = 8;
    }
    bVar8 = (sps_svc_ext->vui).vui_ext_num_entries_minus1 <= uVar7;
    uVar7 = uVar7 + 1;
    if (bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void write_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    bs_write_ue(b, sps_svc_ext->vui.vui_ext_num_entries_minus1);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        bs_write_u(b, 3, sps_svc_ext->vui.vui_ext_dependency_id[i]);
        bs_write_u(b, 4, sps_svc_ext->vui.vui_ext_quality_id[i]);
        bs_write_u(b, 3, sps_svc_ext->vui.vui_ext_temporal_id[i]);
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_timing_info_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            bs_write_u(b, 32, sps_svc_ext->vui.vui_ext_num_units_in_tick[i]);
            bs_write_u(b, 32, sps_svc_ext->vui.vui_ext_time_scale[i]);
            bs_write_u1(b, sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i]);
        }

        bs_write_u1(b, sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            write_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            write_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            bs_write_u1(b, sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i]);
        }
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i]);
    }
}